

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

VoidPromiseAndPipeline * __thiscall
capnp::QueuedClient::call
          (VoidPromiseAndPipeline *__return_storage_ptr__,QueuedClient *this,uint64_t interfaceId,
          uint16_t methodId,Own<capnp::CallContextHook> *context)

{
  Own<capnp::QueuedPipeline> pipeline;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:349:9),_kj::Own<CallResultHolder>_>
  completionPromise;
  ForkedPromise<kj::Own<CallResultHolder>_> callResultPromise;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:342:9),_kj::Own<CallResultHolder>_>
  pipelinePromise;
  PropagateException local_99;
  undefined1 local_98 [8];
  QueuedPipeline *pQStack_90;
  undefined1 local_88 [8];
  EventLoop *pEStack_80;
  undefined1 local_70 [32];
  Own<kj::_::PromiseNode> local_50;
  Own<capnp::CallContextHook> local_40;
  
  kj::ForkedPromise<kj::Own<capnp::ClientHook>_>::addBranch
            ((ForkedPromise<kj::Own<capnp::ClientHook>_> *)local_88);
  local_40.disposer = context->disposer;
  local_40.ptr = context->ptr;
  context->ptr = (CallContextHook *)0x0;
  local_50.disposer = (Disposer *)interfaceId;
  local_50.ptr._0_2_ = methodId;
  kj::Promise<kj::Own<capnp::ClientHook>>::
  then<kj::CaptureByMove<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda(kj::Own<capnp::CallContextHook>&&,kj::Own<capnp::ClientHook>&&)_1_,kj::Own<capnp::CallContextHook>>,kj::_::PropagateException>
            ((Promise<kj::Own<capnp::ClientHook>> *)local_98,
             (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:334:9),_kj::Own<capnp::CallContextHook>_>
              *)local_88,(PropagateException *)&local_50);
  kj::Promise<kj::Own<CallResultHolder>_>::fork
            ((Promise<kj::Own<CallResultHolder>_> *)(local_70 + 0x10));
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_98);
  kj::Own<capnp::CallContextHook>::dispose(&local_40);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_88);
  kj::_::ForkHub<kj::Own<CallResultHolder>_>::addBranch
            ((ForkHub<kj::Own<CallResultHolder>_> *)local_98);
  kj::
  Promise<kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>>
  ::
  then<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda(kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>&&)_1_,kj::_::PropagateException>
            ((Promise<kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>>
              *)&local_50,(anon_class_1_0_00000001_for_func *)local_98,
             (PropagateException *)local_88);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_98);
  kj::refcounted<capnp::QueuedPipeline,kj::Promise<kj::Own<capnp::PipelineHook>>>
            ((kj *)local_98,(Promise<kj::Own<capnp::PipelineHook>_> *)&local_50);
  kj::_::ForkHub<kj::Own<CallResultHolder>_>::addBranch
            ((ForkHub<kj::Own<CallResultHolder>_> *)local_70);
  kj::
  Promise<kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>>
  ::
  then<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda(kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>&&)_2_,kj::_::PropagateException>
            ((Promise<kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>>
              *)local_88,(anon_class_1_0_00000001_for_func *)local_70,&local_99);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_70);
  (__return_storage_ptr__->promise).super_PromiseBase.node.disposer = (Disposer *)local_88;
  (__return_storage_ptr__->promise).super_PromiseBase.node.ptr = (PromiseNode *)pEStack_80;
  pEStack_80 = (EventLoop *)0x0;
  (__return_storage_ptr__->pipeline).disposer = (Disposer *)local_98;
  (__return_storage_ptr__->pipeline).ptr = &pQStack_90->super_PipelineHook;
  pQStack_90 = (QueuedPipeline *)0x0;
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_88);
  kj::Own<capnp::QueuedPipeline>::dispose((Own<capnp::QueuedPipeline> *)local_98);
  kj::Own<kj::_::PromiseNode>::dispose(&local_50);
  kj::Own<kj::_::ForkHub<kj::Own<CallResultHolder>_>_>::dispose
            ((Own<kj::_::ForkHub<kj::Own<CallResultHolder>_>_> *)(local_70 + 0x10));
  return __return_storage_ptr__;
}

Assistant:

VoidPromiseAndPipeline call(uint64_t interfaceId, uint16_t methodId,
                              kj::Own<CallContextHook>&& context) override {
    // This is a bit complicated.  We need to initiate this call later on.  When we initiate the
    // call, we'll get a void promise for its completion and a pipeline object.  Right now, we have
    // to produce a similar void promise and pipeline that will eventually be chained to those.
    // The problem is, these are two independent objects, but they both depend on the result of
    // one future call.
    //
    // So, we need to set up a continuation that will initiate the call later, then we need to
    // fork the promise for that continuation in order to send the completion promise and the
    // pipeline to their respective places.
    //
    // TODO(perf):  Too much reference counting?  Can we do better?  Maybe a way to fork
    //   Promise<Tuple<T, U>> into Tuple<Promise<T>, Promise<U>>?

    struct CallResultHolder: public kj::Refcounted {
      // Essentially acts as a refcounted \VoidPromiseAndPipeline, so that we can create a promise
      // for it and fork that promise.

      VoidPromiseAndPipeline content;
      // One branch of the fork will use content.promise, the other branch will use
      // content.pipeline.  Neither branch will touch the other's piece.

      inline CallResultHolder(VoidPromiseAndPipeline&& content): content(kj::mv(content)) {}

      kj::Own<CallResultHolder> addRef() { return kj::addRef(*this); }
    };

    // Create a promise for the call initiation.
    kj::ForkedPromise<kj::Own<CallResultHolder>> callResultPromise =
        promiseForCallForwarding.addBranch().then(kj::mvCapture(context,
        [=](kj::Own<CallContextHook>&& context, kj::Own<ClientHook>&& client){
          return kj::refcounted<CallResultHolder>(
              client->call(interfaceId, methodId, kj::mv(context)));
        })).fork();

    // Create a promise that extracts the pipeline from the call initiation, and construct our
    // QueuedPipeline to chain to it.
    auto pipelinePromise = callResultPromise.addBranch().then(
        [](kj::Own<CallResultHolder>&& callResult){
          return kj::mv(callResult->content.pipeline);
        });
    auto pipeline = kj::refcounted<QueuedPipeline>(kj::mv(pipelinePromise));

    // Create a promise that simply chains to the void promise produced by the call initiation.
    auto completionPromise = callResultPromise.addBranch().then(
        [](kj::Own<CallResultHolder>&& callResult){
          return kj::mv(callResult->content.promise);
        });

    // OK, now we can actually return our thing.
    return VoidPromiseAndPipeline { kj::mv(completionPromise), kj::mv(pipeline) };
  }